

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrTsim.c
# Opt level: O3

int Pdr_ManExtendOne(Aig_Man_t *pAig,Aig_Obj_t *pObj,Vec_Int_t *vUndo,Vec_Int_t *vVis)

{
  Vec_Ptr_t *pVVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  int *piVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  void *pvVar10;
  Aig_Obj_t *pObj_00;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  
  if (((*(uint *)&pObj->field_0x18 & 7) != 2) || ((pObj->field_0).CioId < pAig->nTruePis)) {
    __assert_fail("Saig_ObjIsLo(pAig, pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrTsim.c"
                  ,0xcb,"int Pdr_ManExtendOne(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  if (pObj->TravId != pAig->nTravIds) {
    __assert_fail("Aig_ObjIsTravIdCurrent(pAig, pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrTsim.c"
                  ,0xcc,"int Pdr_ManExtendOne(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  iVar8 = pObj->Id;
  uVar11 = pAig->pTerSimData[iVar8 >> 4] >> ((char)iVar8 * '\x02' & 0x1fU) & 3;
  if (1 < uVar11 - 1) {
    __assert_fail("Value == PDR_ZER || Value == PDR_ONE",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrTsim.c"
                  ,0xcf,"int Pdr_ManExtendOne(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  Vec_IntPush(vUndo,iVar8);
  Vec_IntPush(vUndo,uVar11);
  iVar8 = pObj->Id >> 4;
  uVar11 = pAig->pTerSimData[iVar8];
  bVar3 = (char)pObj->Id * '\x02';
  pAig->pTerSimData[iVar8] = (~(uVar11 >> (bVar3 & 0x1f)) & 3) << (bVar3 & 0x1f) ^ uVar11;
  vVis->nSize = 0;
  Vec_IntPush(vVis,pObj->Id);
  iVar8 = vVis->nSize;
  if (0 < iVar8) {
    uVar11 = 0xffffffff;
    lVar6 = 0;
    do {
      pVVar1 = pAig->vObjs;
      if (pVVar1 == (Vec_Ptr_t *)0x0) {
        pvVar10 = (void *)0x0;
      }
      else {
        uVar9 = vVis->pArray[lVar6];
        if (((int)uVar9 < 0) || (pVVar1->nSize <= (int)uVar9)) {
LAB_00579951:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar10 = pVVar1->pArray[uVar9];
      }
      if (pAig->pFanData == (int *)0x0) {
        __assert_fail("pAig->pFanData",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrTsim.c"
                      ,0xd9,
                      "int Pdr_ManExtendOne(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, Vec_Int_t *)");
      }
      if ((*(uint *)((long)pvVar10 + 0x18) & 0xffffffc0) != 0) {
        uVar9 = 0;
        do {
          if (uVar9 == 0) {
            if (pAig->nFansAlloc <= *(int *)((long)pvVar10 + 0x24)) {
              __assert_fail("ObjId < p->nFansAlloc",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                            ,0x1a8,"int Aig_ObjFanout0Int(Aig_Man_t *, int)");
            }
            iVar8 = *(int *)((long)pvVar10 + 0x24) * 5;
          }
          else {
            if (pAig->nFansAlloc <= (int)uVar11 / 2) {
              __assert_fail("iFan/2 < p->nFansAlloc",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                            ,0x1a9,"int Aig_ObjFanoutNext(Aig_Man_t *, int)");
            }
            iVar8 = (uVar11 & 1) + ((int)uVar11 >> 1) * 5 + 3;
          }
          pVVar1 = pAig->vObjs;
          uVar11 = pAig->pFanData[iVar8];
          if (pVVar1 == (Vec_Ptr_t *)0x0) {
            pObj_00 = (Aig_Obj_t *)0x0;
          }
          else {
            uVar7 = (int)uVar11 >> 1;
            if (((int)uVar7 < 0) || (pVVar1->nSize <= (int)uVar7)) goto LAB_00579951;
            pObj_00 = (Aig_Obj_t *)pVVar1->pArray[uVar7];
          }
          if (pObj_00->TravId == pAig->nTravIds) {
            iVar8 = pObj_00->Id;
            if (iVar8 <= *(int *)((long)pvVar10 + 0x24)) {
              __assert_fail("Aig_ObjId(pObj) < Aig_ObjId(pFanout)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrTsim.c"
                            ,0xdd,
                            "int Pdr_ManExtendOne(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                           );
            }
            uVar7 = pAig->pTerSimData[iVar8 >> 4] >> ((char)iVar8 * '\x02' & 0x1fU) & 3;
            if ((uVar7 != 3) && (uVar4 = Pdr_ManExtendOneEval(pAig,pObj_00), uVar4 != uVar7)) {
              if (uVar4 != 3) {
                __assert_fail("Value2 == PDR_UND",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrTsim.c"
                              ,0xe4,
                              "int Pdr_ManExtendOne(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                             );
              }
              Vec_IntPush(vUndo,pObj_00->Id);
              Vec_IntPush(vUndo,uVar7);
              uVar7 = (uint)*(undefined8 *)&pObj_00->field_0x18;
              if ((uVar7 & 7) == 3) {
                return 0;
              }
              if ((uVar7 & 7) - 7 < 0xfffffffe) {
                __assert_fail("Aig_ObjIsNode(pFanout)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrTsim.c"
                              ,0xe9,
                              "int Pdr_ManExtendOne(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                             );
              }
              iVar8 = pObj_00->Id;
              uVar7 = vVis->nSize;
              uVar13 = (ulong)uVar7;
              if (uVar7 == vVis->nCap) {
                if ((int)uVar7 < 0x10) {
                  if (vVis->pArray == (int *)0x0) {
                    piVar5 = (int *)malloc(0x40);
                  }
                  else {
                    piVar5 = (int *)realloc(vVis->pArray,0x40);
                  }
                  vVis->pArray = piVar5;
                  iVar12 = 0x10;
                  if (piVar5 == (int *)0x0) {
LAB_00579a0b:
                    __assert_fail("p->pArray",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                                  ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
                  }
                }
                else {
                  if (vVis->pArray == (int *)0x0) {
                    piVar5 = (int *)malloc(uVar13 * 8);
                  }
                  else {
                    piVar5 = (int *)realloc(vVis->pArray,uVar13 * 8);
                  }
                  vVis->pArray = piVar5;
                  if (piVar5 == (int *)0x0) goto LAB_00579a0b;
                  iVar12 = uVar7 * 2;
                }
                vVis->nCap = iVar12;
                uVar13 = (ulong)(uint)vVis->nSize;
              }
              else {
                piVar5 = vVis->pArray;
              }
              vVis->nSize = (int)uVar13 + 1;
              if (0 < (int)uVar13) {
                do {
                  if (piVar5[uVar13 - 1] <= iVar8) goto LAB_00579906;
                  piVar5[uVar13] = piVar5[uVar13 - 1];
                  bVar2 = 1 < uVar13;
                  uVar13 = uVar13 - 1;
                } while (bVar2);
                uVar13 = 0;
              }
LAB_00579906:
              piVar5[(int)uVar13] = iVar8;
            }
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 < *(uint *)((long)pvVar10 + 0x18) >> 6);
        iVar8 = vVis->nSize;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar8);
  }
  return 1;
}

Assistant:

int Pdr_ManExtendOne( Aig_Man_t * pAig, Aig_Obj_t * pObj, Vec_Int_t * vUndo, Vec_Int_t * vVis )
{
    Aig_Obj_t * pFanout;
    int i, k, iFanout = -1, Value, Value2;
    assert( Saig_ObjIsLo(pAig, pObj) );
    assert( Aig_ObjIsTravIdCurrent(pAig, pObj) );
    // save original value
    Value = Pdr_ManSimInfoGet( pAig, pObj );
    assert( Value == PDR_ZER || Value == PDR_ONE );
    Vec_IntPush( vUndo, Aig_ObjId(pObj) );
    Vec_IntPush( vUndo, Value );
    // update original value
    Pdr_ManSimInfoSet( pAig, pObj, PDR_UND );
    // traverse
    Vec_IntClear( vVis );
    Vec_IntPush( vVis, Aig_ObjId(pObj) );
    Aig_ManForEachObjVec( vVis, pAig, pObj, i )
    {
        Aig_ObjForEachFanout( pAig, pObj, pFanout, iFanout, k )
        {
            if ( !Aig_ObjIsTravIdCurrent(pAig, pFanout) )
                continue;
            assert( Aig_ObjId(pObj) < Aig_ObjId(pFanout) );
            Value = Pdr_ManSimInfoGet( pAig, pFanout );
            if ( Value == PDR_UND )
                continue;
            Value2 = Pdr_ManExtendOneEval( pAig, pFanout );
            if ( Value2 == Value )
                continue;
            assert( Value2 == PDR_UND );
            Vec_IntPush( vUndo, Aig_ObjId(pFanout) );
            Vec_IntPush( vUndo, Value );
            if ( Aig_ObjIsCo(pFanout) )
                return 0;
            assert( Aig_ObjIsNode(pFanout) );
            Vec_IntPushOrder( vVis, Aig_ObjId(pFanout) );
        }
    }
    return 1;
}